

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O0

int __thiscall Timidity::Renderer::load_missing_instruments(Renderer *this)

{
  int iVar1;
  int iVar2;
  int local_18;
  int local_14;
  int errors;
  int i;
  Renderer *this_local;
  
  local_14 = 0x80;
  local_18 = 0;
  while (iVar2 = local_14 + -1, local_14 != 0) {
    if ((&tonebank)[iVar2] != 0) {
      iVar1 = fill_bank(this,0,iVar2);
      local_18 = iVar1 + local_18;
    }
    local_14 = iVar2;
    if ((&drumset)[iVar2] != 0) {
      iVar2 = fill_bank(this,1,iVar2);
      local_18 = iVar2 + local_18;
    }
  }
  return local_18;
}

Assistant:

int Renderer::load_missing_instruments()
{
	int i = MAXBANK, errors = 0;
	while (i--)
	{
		if (tonebank[i] != NULL)
			errors += fill_bank(this, 0,i);
		if (drumset[i] != NULL)
			errors += fill_bank(this, 1,i);
	}
	return errors;
}